

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_33061f::t_debugger::f_print_value
          (t_debugger *this,t_pvalue *a_value,size_t a_depth)

{
  t_object *ptVar1;
  size_t sVar2;
  long *plVar3;
  t_object *ptVar4;
  ulong uVar5;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *paVar6;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *paVar7;
  undefined1 *puVar8;
  long lVar9;
  ulong uVar10;
  char *__format;
  FILE *pFVar11;
  int __c;
  char *pcVar12;
  size_t sVar13;
  size_t a_depth_00;
  t_type *ptVar14;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 aVar15;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 local_40;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 local_38;
  
  ptVar1 = (a_value->super_t_pointer).v_p;
  pFVar11 = (FILE *)this->v_out;
  switch(ptVar1) {
  case (t_object *)0x0:
    pcVar12 = "null";
    break;
  case (t_object *)0x1:
    pcVar12 = "false";
    break;
  case (t_object *)0x2:
    pcVar12 = "true";
    break;
  case (t_object *)0x3:
    paVar7 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)ptVar1->v_data;
    if (ptVar1 < (t_object *)0x5) {
      paVar7 = &a_value->field_0;
    }
    pcVar12 = (char *)paVar7->v_integer;
    __format = "%ld";
LAB_0017d9d9:
    fprintf(pFVar11,__format,pcVar12);
    return;
  case (t_object *)0x4:
    paVar7 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)ptVar1->v_data;
    if (ptVar1 < (t_object *)0x5) {
      paVar7 = &a_value->field_0;
    }
    fprintf(pFVar11,"%g",paVar7->v_integer);
    return;
  default:
    fprintf(pFVar11,"@%p");
    a_depth_00 = a_depth - 1;
    if (a_depth_00 != 0) {
      fputc(0x28,(FILE *)this->v_out);
      ptVar14 = ((a_value->super_t_pointer).v_p)->v_type;
      sVar13 = ptVar14->v_instance_fields;
      if (sVar13 != 0) {
        ptVar14 = ptVar14 + 1;
        lVar9 = 8;
        while( true ) {
          sVar13 = sVar13 - 1;
          fprintf((FILE *)this->v_out,"%ls: ",
                  *(undefined8 *)(*(long *)((ptVar14->v_this).v_p._M_b._M_p)->v_data + 0x20));
          ptVar1 = (a_value->super_t_pointer).v_p;
          sVar2 = ptVar1->v_type->v_fields_offset;
          local_40 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)
                      (ptVar1->v_data + lVar9 + sVar2 + -0x50);
          local_38 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)
                      (ptVar1->v_data + lVar9 + sVar2 + -0x48);
          f_print_value(this,(t_pvalue *)&local_40,a_depth_00);
          if (sVar13 == 0) break;
          fputs(", ",(FILE *)this->v_out);
          lVar9 = lVar9 + 0x10;
          ptVar14 = (t_type *)&ptVar14->v_super;
        }
      }
      fputc(0x29,(FILE *)this->v_out);
    }
    ptVar1 = (a_value->super_t_pointer).v_p;
    ptVar14 = ptVar1->v_type;
    uVar10 = ptVar14->v_depth;
    if (uVar10 != 0) {
      if ((undefined8 *)ptVar14->v_ids[1] == &xemmai::v__type_id<xemmai::t_string>) {
        pFVar11 = (FILE *)this->v_out;
        pcVar12 = ptVar1->v_data + 8;
        __format = " \"%ls\"";
        goto LAB_0017d9d9;
      }
      if ((uVar10 != 0) && ((undefined8 *)ptVar14->v_ids[1] == &xemmai::v__type_id<xemmai::t_tuple>)
         ) {
        fputs(" \'(",(FILE *)this->v_out);
        if (a_depth_00 == 0) {
          fputs("...",(FILE *)this->v_out);
        }
        else {
          ptVar1 = (a_value->super_t_pointer).v_p;
          if (*(long *)ptVar1->v_data != 0) {
            local_40 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)
                        (ptVar1->v_data + 8);
            local_38 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)
                        (ptVar1->v_data + 0x10);
            f_print_value(this,(t_pvalue *)&local_40,a_depth_00);
            if (1 < *(ulong *)ptVar1->v_data) {
              paVar6 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)
                       (ptVar1->v_data + 0x20);
              uVar10 = 1;
              do {
                fputs(", ",(FILE *)this->v_out);
                local_40 = paVar6[-1];
                local_38 = *paVar6;
                f_print_value(this,(t_pvalue *)&local_40,a_depth_00);
                uVar10 = uVar10 + 1;
                paVar6 = paVar6 + 2;
              } while (uVar10 < *(ulong *)ptVar1->v_data);
            }
          }
        }
        pFVar11 = (FILE *)this->v_out;
        __c = 0x29;
        goto LAB_0017de39;
      }
    }
    if (1 < uVar10) {
      if ((undefined8 *)ptVar14->v_ids[2] == &xemmai::v__type_id<xemmai::t_list>) {
        fputs(" [",(FILE *)this->v_out);
        if (a_depth_00 == 0) {
          fputs("...",(FILE *)this->v_out);
        }
        else {
          ptVar1 = (a_value->super_t_pointer).v_p;
          lVar9._0_1_ = ptVar1[1].v_color;
          lVar9._1_1_ = ptVar1[1].v_reviving;
          lVar9._2_6_ = *(undefined6 *)&ptVar1[1].field_0x1a;
          if (lVar9 != 0) {
            paVar6 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)
                     xemmai::t_list::operator[]((t_list *)ptVar1->v_data,0);
            local_40 = *paVar6;
            local_38 = paVar6[1];
            f_print_value(this,(t_pvalue *)&local_40,a_depth_00);
            uVar10._0_1_ = ptVar1[1].v_color;
            uVar10._1_1_ = ptVar1[1].v_reviving;
            uVar10._2_6_ = *(undefined6 *)&ptVar1[1].field_0x1a;
            if (1 < uVar10) {
              aVar15.v_integer = 1;
              do {
                fputs(", ",(FILE *)this->v_out);
                local_40 = aVar15;
                xemmai::t_list::f_validate((t_list *)ptVar1->v_data,&local_40.v_integer);
                pcVar12 = (ptVar1[1].v_scan)->v_data + (local_40.v_integer - 0x48);
                ptVar4 = ptVar1[1].v_previous;
                puVar8 = *(undefined1 **)ptVar4->v_data;
                if (pcVar12 < puVar8) {
                  puVar8 = (undefined1 *)0x0;
                }
                lVar9 = ((long)pcVar12 - (long)puVar8) * 0x10;
                local_40 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)
                            ((long)ptVar4 + lVar9 + 0x50);
                local_38 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)
                            ((long)ptVar4 + lVar9 + 0x58);
                f_print_value(this,(t_pvalue *)&local_40,a_depth_00);
                aVar15.v_integer = aVar15.v_integer + 1;
                uVar5._0_1_ = ptVar1[1].v_color;
                uVar5._1_1_ = ptVar1[1].v_reviving;
                uVar5._2_6_ = *(undefined6 *)&ptVar1[1].field_0x1a;
              } while ((ulong)aVar15 < uVar5);
            }
          }
        }
        fputc(0x5d,(FILE *)this->v_out);
      }
      else if ((1 < uVar10) &&
              ((undefined8 *)ptVar14->v_ids[2] == &xemmai::v__type_id<xemmai::t_map>)) {
        fputs(" {",(FILE *)this->v_out);
        if (a_depth_00 == 0) {
          fputs("...",(FILE *)this->v_out);
        }
        else {
          plVar3 = *(long **)((ptVar1[1].v_previous)->v_data + 8);
          pcVar12 = (ptVar1[1].v_previous)->v_data + 0x20;
          do {
            if (*(long *)pcVar12 != 0) goto LAB_0017db8f;
            pcVar12 = pcVar12 + 0x30;
          } while (pcVar12 < plVar3);
          pcVar12 = (char *)0x0;
LAB_0017db8f:
          if (pcVar12 != (char *)0x0) {
            do {
              local_40 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)(pcVar12 + 0x10);
              local_38 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)(pcVar12 + 0x18);
              f_print_value(this,(t_pvalue *)&local_40,a_depth_00);
              fputs(": ",(FILE *)this->v_out);
              local_40 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)(pcVar12 + 0x20);
              local_38 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)(pcVar12 + 0x28);
              f_print_value(this,(t_pvalue *)&local_40,a_depth_00);
              do {
                pcVar12 = pcVar12 + 0x30;
                if (plVar3 <= pcVar12) {
                  pcVar12 = (char *)0x0;
                  break;
                }
              } while (*(long *)pcVar12 == 0);
              if (pcVar12 == (char *)0x0) break;
              fputs(", ",(FILE *)this->v_out);
            } while( true );
          }
        }
        pFVar11 = (FILE *)this->v_out;
        __c = 0x7d;
LAB_0017de39:
        fputc(__c,pFVar11);
        return;
      }
    }
    return;
  }
  fputs(pcVar12,pFVar11);
  return;
}

Assistant:

void f_print_value(const t_pvalue& a_value, size_t a_depth)
	{
		switch (a_value.f_tag()) {
		case c_tag__NULL:
			std::fputs("null", v_out);
			break;
		case c_tag__FALSE:
			std::fputs("false", v_out);
			break;
		case c_tag__TRUE:
			std::fputs("true", v_out);
			break;
		case c_tag__INTEGER:
			std::fprintf(v_out, "%" PRIdPTR, f_as<intptr_t>(a_value));
			break;
		case c_tag__FLOAT:
			std::fprintf(v_out, "%g", f_as<double>(a_value));
			break;
		default:
			std::fprintf(v_out, "@%p", static_cast<t_object*>(a_value));
			if (--a_depth > 0) {
				std::fputc('(', v_out);
				auto type = a_value->f_type();
				auto n = type->v_instance_fields;
				if (n > 0) {
					size_t i = 0;
					while (true) {
						std::fprintf(v_out, "%ls: ", type->f_fields()[i].first->f_as<t_symbol>().f_string().c_str());
						f_print_value(a_value->f_fields()[i], a_depth);
						if (++i >= n) break;
						std::fputs(", ", v_out);
					}
				}
				std::fputc(')', v_out);
			}
			if (f_is<t_string>(a_value)) {
				std::fprintf(v_out, " \"%ls\"", static_cast<const wchar_t*>(a_value->f_as<t_string>()));
			} else if (f_is<t_tuple>(a_value)) {
				std::fputs(" '(", v_out);
				f_print_sequence<t_tuple>(a_value, a_depth);
				std::fputc(')', v_out);
			} else if (f_is<t_list>(a_value)) {
				std::fputs(" [", v_out);
				f_print_sequence<t_list>(a_value, a_depth);
				std::fputc(']', v_out);
			} else if (f_is<t_map>(a_value)) {
				auto& map = a_value->f_as<t_map>();
				std::fputs(" {", v_out);
				if (a_depth <= 0) {
					std::fputs("...", v_out);
				} else {
					t_map::t_iterator i(map);
					if (i.f_entry()) {
						while (true) {
							f_print_value(i.f_entry()->f_key(), a_depth);
							std::fputs(": ", v_out);
							f_print_value(i.f_entry()->v_value, a_depth);
							i.f_next();
							if (!i.f_entry()) break;
							std::fputs(", ", v_out);
						}
					}
				}
				std::fputc('}', v_out);
			}
		}
	}